

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  char **ppcVar9;
  ifstream *this;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  undefined **ppuVar13;
  bool bVar14;
  allocator local_409;
  int end_offset;
  int end_address;
  int start_offset;
  int start_address;
  string local_3f8;
  int local_3d4;
  string data_type;
  ostringstream error_message_8;
  ifstream ifs;
  byte abStack_218 [488];
  
  start_address = 0;
  start_offset = 0;
  end_address = -1;
  end_offset = -1;
  std::__cxx11::string::string((string *)&data_type,"s",(allocator *)&ifs);
  do {
    while( true ) {
      iVar5 = ya_getopt_long(argc,argv,"S:s:E:e:h",(option *)0x0,(int *)0x0);
      if (iVar5 == 0x45) break;
      if (iVar5 == 0x53) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
        bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&start_address);
        bVar14 = start_address < 0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar3 || bVar14) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -S option must be a ");
          std::operator<<(poVar6,"non-negative integer");
          std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
          sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
          goto LAB_00103b8e;
        }
      }
      else if (iVar5 == 0x65) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
        bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&end_offset);
        bVar14 = end_offset < 0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar3 || bVar14) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -e option must be a ");
          std::operator<<(poVar6,"non-negative integer");
          std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
          sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
          goto LAB_00103b8e;
        }
      }
      else {
        if (iVar5 != 0x73) {
          if (iVar5 != -1) {
            if (iVar5 == 0x68) {
              uVar8 = 0;
              anon_unknown.dwarf_20c4::PrintUsage((ostream *)&std::cout);
              goto LAB_00103ba8;
            }
            anon_unknown.dwarf_20c4::PrintUsage((ostream *)&std::cerr);
            goto LAB_00103ba5;
          }
          if ((end_address != -1) && (end_address < start_address)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            poVar6 = std::operator<<((ostream *)&ifs,"End address must be equal to or greater than "
                                    );
            std::operator<<(poVar6,"start address");
            std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
            sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
            goto LAB_00103b8e;
          }
          if ((end_offset != -1) && (end_offset < start_offset)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            poVar6 = std::operator<<((ostream *)&ifs,
                                     "End offset number must be equal to or greater than ");
            std::operator<<(poVar6,"start offset number");
            std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
            sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
            goto LAB_00103b8e;
          }
          lVar10 = (long)(argc - ya_optind);
          ppcVar9 = argv + (argc - lVar10);
          pcVar12 = (char *)0x0;
          goto LAB_001039e2;
        }
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
        bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&start_offset);
        bVar14 = start_offset < 0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar3 || bVar14) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a ");
          std::operator<<(poVar6,"non-negative integer");
          std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
          sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
          goto LAB_00103b8e;
        }
      }
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_8);
    bVar3 = sptk::ConvertStringToInteger((string *)&ifs,&end_address);
    bVar14 = -1 < end_address;
    std::__cxx11::string::~string((string *)&ifs);
  } while (bVar3 && bVar14);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar6 = std::operator<<((ostream *)&ifs,"The argument for the -E option must be a ");
  std::operator<<(poVar6,"non-negative integer");
  std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
  sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
LAB_00103b8e:
  std::__cxx11::string::~string((string *)&error_message_8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
LAB_00103ba5:
  uVar8 = 1;
LAB_00103ba8:
  std::__cxx11::string::~string((string *)&data_type);
  return uVar8;
LAB_001039e2:
  if (lVar10 < 1) goto LAB_00103a40;
  pcVar11 = *ppcVar9;
  if (*pcVar11 == '+') {
    std::__cxx11::string::string((string *)&ifs,pcVar11,(allocator *)&error_message_8);
    std::__cxx11::string::substr((ulong)&error_message_8,(ulong)&ifs);
    std::__cxx11::string::operator=((string *)&data_type,(string *)&error_message_8);
    std::__cxx11::string::~string((string *)&error_message_8);
    std::__cxx11::string::~string((string *)&ifs);
    pcVar11 = pcVar12;
  }
  else if (pcVar12 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
    sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
    goto LAB_00103b8e;
  }
  lVar10 = lVar10 + -1;
  ppcVar9 = ppcVar9 + 1;
  pcVar12 = pcVar11;
  goto LAB_001039e2;
LAB_00103a40:
  bVar3 = sptk::SetBinaryMode();
  if (bVar3) {
    this = &ifs;
    std::ifstream::ifstream(this);
    if (pcVar12 == (char *)0x0) {
LAB_00103bc6:
      cVar4 = std::__basic_file<char>::is_open();
      iVar2 = start_address;
      iVar1 = start_offset;
      iVar5 = end_address;
      local_3d4 = end_offset;
      if (cVar4 == '\0') {
        this = (ifstream *)&std::cin;
      }
      bVar3 = std::operator==("s",&data_type);
      if (bVar3) {
        ppuVar13 = &PTR__ByteSwapInterface_00111a30;
      }
      else {
        bVar3 = std::operator==("h",&data_type);
        if (bVar3) {
          ppuVar13 = &PTR__ByteSwapInterface_00111a80;
        }
        else {
          bVar3 = std::operator==("i",&data_type);
          if (bVar3) {
            ppuVar13 = &PTR__ByteSwapInterface_00111ac0;
          }
          else {
            bVar3 = std::operator==("l",&data_type);
            if (bVar3) {
              ppuVar13 = &PTR__ByteSwapInterface_00111b00;
            }
            else {
              bVar3 = std::operator==("S",&data_type);
              if (bVar3) {
                ppuVar13 = &PTR__ByteSwapInterface_00111b40;
              }
              else {
                bVar3 = std::operator==("H",&data_type);
                if (bVar3) {
                  ppuVar13 = &PTR__ByteSwapInterface_00111b80;
                }
                else {
                  bVar3 = std::operator==("I",&data_type);
                  if (bVar3) {
                    ppuVar13 = &PTR__ByteSwapInterface_00111bc0;
                  }
                  else {
                    bVar3 = std::operator==("L",&data_type);
                    if (bVar3) {
                      ppuVar13 = &PTR__ByteSwapInterface_00111c00;
                    }
                    else {
                      bVar3 = std::operator==("f",&data_type);
                      if (bVar3) {
                        ppuVar13 = &PTR__ByteSwapInterface_00111c40;
                      }
                      else {
                        bVar3 = std::operator==("d",&data_type);
                        if (bVar3) {
                          ppuVar13 = &PTR__ByteSwapInterface_00111c80;
                        }
                        else {
                          bVar3 = std::operator==("e",&data_type);
                          if (!bVar3) {
                            std::__cxx11::ostringstream::ostringstream
                                      ((ostringstream *)&error_message_8);
                            std::operator<<((ostream *)&error_message_8,
                                            "Unexpected argument for the +type option");
                            std::__cxx11::string::string((string *)&local_3f8,"swab",&local_409);
                            sptk::PrintErrorMessage(&local_3f8,&error_message_8);
                            goto LAB_00103ade;
                          }
                          ppuVar13 = &PTR__ByteSwapInterface_00111cc0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      plVar7 = (long *)operator_new(0x18);
      *plVar7 = (long)ppuVar13;
      *(int *)(plVar7 + 1) = iVar2;
      *(int *)((long)plVar7 + 0xc) = iVar1;
      *(int *)(plVar7 + 2) = iVar5;
      *(int *)((long)plVar7 + 0x14) = local_3d4;
      cVar4 = (*(code *)ppuVar13[2])(plVar7,this);
      if (cVar4 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
        std::operator<<((ostream *)&error_message_8,"Failed to swap bytes");
        std::__cxx11::string::string((string *)&local_3f8,"swab",&local_409);
        sptk::PrintErrorMessage(&local_3f8,&error_message_8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
      }
      uVar8 = (uint)(cVar4 == '\0');
      (**(code **)(*plVar7 + 8))(plVar7);
    }
    else {
      std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar12);
      if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) goto LAB_00103bc6;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_8);
      poVar6 = std::operator<<((ostream *)&error_message_8,"Cannot open file ");
      std::operator<<(poVar6,pcVar12);
      std::__cxx11::string::string((string *)&local_3f8,"swab",&local_409);
      sptk::PrintErrorMessage(&local_3f8,&error_message_8);
LAB_00103ade:
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_8);
      uVar8 = 1;
    }
    std::ifstream::~ifstream(&ifs);
    goto LAB_00103ba8;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"Cannot set translation mode");
  std::__cxx11::string::string((string *)&error_message_8,"swab",(allocator *)&local_3f8);
  sptk::PrintErrorMessage((string *)&error_message_8,(ostringstream *)&ifs);
  goto LAB_00103b8e;
}

Assistant:

int main(int argc, char* argv[]) {
  int start_address(kDefaultStartAddress);
  int start_offset(kDefaultStartOffset);
  int end_address(kDefaultEndAddress);
  int end_offset(kDefaultEndOffset);
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "S:s:E:e:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'S': {
        if (!sptk::ConvertStringToInteger(optarg, &start_address) ||
            start_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &start_offset) ||
            start_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'E': {
        if (!sptk::ConvertStringToInteger(optarg, &end_address) ||
            end_address < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -E option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &end_offset) ||
            end_offset < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -e option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("swab", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (kMagicNumberForEnd != end_address && end_address < start_address) {
    std::ostringstream error_message;
    error_message << "End address must be equal to or greater than "
                  << "start address";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (kMagicNumberForEnd != end_offset && end_offset < start_offset) {
    std::ostringstream error_message;
    error_message << "End offset number must be equal to or greater than "
                  << "start offset number";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("swab", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  ByteSwapWrapper swap_byte(data_type, start_address, start_offset, end_address,
                            end_offset);

  if (!swap_byte.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  if (!swap_byte.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to swap bytes";
    sptk::PrintErrorMessage("swab", error_message);
    return 1;
  }

  return 0;
}